

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_loading_thread.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ALLEGRO_BITMAP *bitmap;
  undefined8 uVar6;
  long lVar7;
  ALLEGRO_BITMAP *bitmap_00;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  ulong uVar14;
  char *format;
  int iVar15;
  ALLEGRO_BITMAP **ppAVar16;
  int iVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  ALLEGRO_EVENT event;
  int local_78 [8];
  int local_58;
  
  cVar2 = al_install_system(0x5020700,atexit);
  if (cVar2 == '\0') {
    format = "Could not init Allegro.\n";
  }
  else {
    al_init_image_addon();
    al_init_font_addon();
    al_init_primitives_addon();
    al_install_mouse();
    al_install_keyboard();
    bitmap = (ALLEGRO_BITMAP *)al_load_bitmap("data/cursor.tga");
    log_printf("default bitmap without display: %p\n",bitmap);
    al_set_new_bitmap_flags(0x400);
    uVar6 = al_load_bitmap("data/cursor.tga");
    log_printf("video bitmap without display: %p\n",uVar6);
    log_printf("%p before create_display: ",bitmap);
    print_bitmap_flags(bitmap);
    log_printf("\n");
    lVar7 = al_create_display(0x40,0x40);
    if (lVar7 != 0) {
      bitmap_00 = (ALLEGRO_BITMAP *)al_load_bitmap("data/cursor.tga");
      log_printf("video bitmap with display: %p\n",bitmap_00);
      log_printf("%p after create_display: ",bitmap);
      print_bitmap_flags(bitmap);
      log_printf("\n");
      log_printf("%p after create_display: ",bitmap_00);
      print_bitmap_flags(bitmap_00);
      log_printf("\n");
      al_destroy_display(lVar7);
      log_printf("%p after destroy_display: ",bitmap);
      print_bitmap_flags(bitmap);
      log_printf("\n");
      log_printf("%p after destroy_display: ",bitmap_00);
      print_bitmap_flags(bitmap_00);
      log_printf("\n");
      uVar6 = al_create_display(0x280,0x1e0);
      log_printf("%p after create_display: ",bitmap);
      print_bitmap_flags(bitmap);
      log_printf("\n");
      log_printf("%p after create_display: ",bitmap_00);
      print_bitmap_flags(bitmap_00);
      log_printf("\n");
      uVar8 = al_load_font("data/fixed_font.tga",0,0);
      mutex = (ALLEGRO_MUTEX *)al_create_mutex();
      uVar9 = al_create_thread(loading_thread,0);
      al_start_thread(uVar9);
      uVar10 = al_create_timer(0x11111111);
      uVar11 = al_create_event_queue();
      uVar12 = al_get_keyboard_event_source();
      al_register_event_source(uVar11,uVar12);
      uVar12 = al_get_display_event_source(uVar6);
      al_register_event_source(uVar11,uVar12);
      uVar12 = al_get_timer_event_source(uVar10);
      al_register_event_source(uVar11,uVar12);
      al_start_timer(uVar10);
      bVar13 = true;
      iVar5 = 0;
      iVar15 = 0;
      do {
        al_wait_for_event(uVar11,local_78);
        if ((local_78[0] == 0x2a) || ((local_78[0] == 10 && (local_58 == 0x3b)))) {
          bVar1 = false;
        }
        else {
          if (local_78[0] == 0x1e) {
            bVar13 = true;
          }
          bVar1 = true;
          if ((bVar13) && (cVar2 = al_is_event_queue_empty(uVar11), cVar2 != '\0')) {
            uVar19 = 0;
            uVar18 = al_map_rgb_f(0,0,0);
            al_get_time();
            al_map_rgb_f(0x3f000000,0x3f19999a,0x3f800000);
            al_clear_to_color();
            al_draw_textf(uVar18,uVar19,0x42700000,0x43a00000,uVar8,0,"Loading %d%%",load_count);
            al_lock_mutex(mutex);
            if (iVar15 < load_count) {
              al_convert_bitmap(bitmaps[iVar15]);
              iVar15 = iVar15 + 1;
            }
            al_unlock_mutex(mutex);
            if (iVar5 < iVar15) {
              al_draw_bitmap(0,bitmaps[iVar5],0);
              if (iVar5 + 1 < iVar15) {
                iVar5 = iVar5 + 1;
              }
              if (-1 < iVar5) {
                iVar17 = 0;
                ppAVar16 = bitmaps;
                uVar14 = 0;
                do {
                  iVar3 = al_get_bitmap_width(*ppAVar16);
                  al_draw_scaled_rotated_bitmap
                            (0,0,(float)(iVar17 + (int)((uVar14 & 0xffffffff) / 0x14) * -0x280),
                             (float)((int)((uVar14 & 0xffffffff) / 0x14) * 0x18 + 0x168),
                             32.0 / (float)iVar3,32.0 / (float)iVar3,0,*ppAVar16,0);
                  uVar14 = uVar14 + 1;
                  ppAVar16 = ppAVar16 + 1;
                  iVar17 = iVar17 + 0x20;
                } while (iVar5 + 1 != uVar14);
              }
            }
            if (iVar15 < 100) {
              al_draw_scaled_rotated_bitmap(bitmap,0);
            }
            al_flip_display();
            bVar13 = false;
          }
        }
      } while (bVar1);
      al_join_thread(uVar9,0);
      al_destroy_mutex(mutex);
      al_destroy_font(uVar8);
      al_destroy_display(uVar6);
      return 0;
    }
    format = "Error creating display\n";
  }
  abort_example(format);
  uVar6 = al_ustr_new("");
  uVar4 = al_get_bitmap_flags(format);
  if ((uVar4 >> 10 & 1) != 0) {
    al_ustr_append_cstr(uVar6," VIDEO");
  }
  uVar14 = al_get_bitmap_flags(format);
  if ((uVar14 & 1) != 0) {
    al_ustr_append_cstr(uVar6," MEMORY");
  }
  uVar4 = al_get_bitmap_flags(format);
  if ((uVar4 >> 0xc & 1) != 0) {
    al_ustr_append_cstr(uVar6," CONVERT");
  }
  al_ustr_trim_ws(uVar6);
  al_ustr_find_replace_cstr(uVar6,0," "," | ");
  uVar8 = al_cstr(uVar6);
  log_printf("%s",uVar8);
  iVar5 = al_ustr_free(uVar6);
  return iVar5;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   bool redraw = true;
   ALLEGRO_FONT *font;
   ALLEGRO_BITMAP *spin, *spin2;
   int current_bitmap = 0;
   int loaded_bitmap = 0;
   ALLEGRO_THREAD *thread;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   al_init_image_addon();
   al_init_font_addon();
   al_init_primitives_addon();
   init_platform_specific();

   open_log();

   al_install_mouse();
   al_install_keyboard();

   spin = al_load_bitmap("data/cursor.tga");
   log_printf("default bitmap without display: %p\n", spin);

   al_set_new_bitmap_flags(ALLEGRO_VIDEO_BITMAP);
   spin2 = al_load_bitmap("data/cursor.tga");
   log_printf("video bitmap without display: %p\n", spin2);
   
   log_printf("%p before create_display: ", spin);
   print_bitmap_flags(spin);
   log_printf("\n");

   display = al_create_display(64, 64);
   if (!display) {
      abort_example("Error creating display\n");
   }
   
   spin2 = al_load_bitmap("data/cursor.tga");
   log_printf("video bitmap with display: %p\n", spin2);
   
   log_printf("%p after create_display: ", spin);
   print_bitmap_flags(spin);
   log_printf("\n");
   
   log_printf("%p after create_display: ", spin2);
   print_bitmap_flags(spin2);
   log_printf("\n");

   al_destroy_display(display);
   
   log_printf("%p after destroy_display: ", spin);
   print_bitmap_flags(spin);
   log_printf("\n");
   
   log_printf("%p after destroy_display: ", spin2);
   print_bitmap_flags(spin2);
   log_printf("\n");

   display = al_create_display(640, 480);
   
   log_printf("%p after create_display: ", spin);
   print_bitmap_flags(spin);
   log_printf("\n");
   
   log_printf("%p after create_display: ", spin2);
   print_bitmap_flags(spin2);
   log_printf("\n");

   font = al_load_font("data/fixed_font.tga", 0, 0);

   mutex = al_create_mutex();
   thread = al_create_thread(loading_thread, NULL);
   al_start_thread(thread);

   timer = al_create_timer(1.0 / 30);
   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_timer_event_source(timer));
   al_start_timer(timer);

   while (1) {
      ALLEGRO_EVENT event;
      al_wait_for_event(queue, &event);

      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE)
         break;
      if (event.type == ALLEGRO_EVENT_KEY_DOWN) {
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
             break;
         }
      if (event.type == ALLEGRO_EVENT_TIMER)
         redraw = true;

      if (redraw && al_is_event_queue_empty(queue)) {
         float x = 20, y = 320;
         int i;
         ALLEGRO_COLOR color = al_map_rgb_f(0, 0, 0);
         float t = al_current_time();

         redraw = false;
         al_clear_to_color(al_map_rgb_f(0.5, 0.6, 1));
         
         al_draw_textf(font, color, x + 40, y, 0, "Loading %d%%",
            100 * load_count / load_total);

         al_lock_mutex(mutex);
         if (loaded_bitmap < load_count) {
            /* This will convert any video bitmaps without a display
             * (all the bitmaps being loaded in the loading_thread) to
             * video bitmaps we can use in the main thread.
             */
            al_convert_bitmap(bitmaps[loaded_bitmap]);
            loaded_bitmap++;
         }
         al_unlock_mutex(mutex);

         if (current_bitmap < loaded_bitmap) {
            int bw;
            al_draw_bitmap(bitmaps[current_bitmap], 0, 0, 0);
            if (current_bitmap + 1 < loaded_bitmap)
               current_bitmap++;

            for (i = 0; i <= current_bitmap; i++) {
               bw = al_get_bitmap_width(bitmaps[i]);
               al_draw_scaled_rotated_bitmap(bitmaps[i],
                  0, 0, (i % 20) * 640 / 20, 360 + (i / 20) * 24,
                  32.0 / bw, 32.0 / bw, 0, 0);
            }
         }
         
         if (loaded_bitmap < load_total) {
            al_draw_scaled_rotated_bitmap(spin,
               16, 16, x, y, 1.0, 1.0, t * ALLEGRO_PI * 2, 0);
         }
         
         al_flip_display();
      }
   }

   al_join_thread(thread, NULL);
   al_destroy_mutex(mutex);
   al_destroy_font(font); 
   al_destroy_display(display);

   close_log(true);

   return 0;
}